

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

double __thiscall HPresolve::getColumnDualPost(HPresolve *this,int col)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  
  uVar11 = (ulong)col;
  piVar2 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  uVar12 = uVar11;
  if (uVar11 < uVar8) {
    piVar3 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
    uVar8 = uVar9;
    if (uVar11 < uVar9) {
      iVar1 = piVar2[uVar11];
      uVar6 = (ulong)iVar1;
      iVar16 = piVar3[uVar11];
      piVar2 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
      piVar3 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
      pdVar4 = (this->super_HPreData).valueRowDual.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar14 = (long)(this->super_HPreData).valueRowDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
      pdVar5 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar15 = (long)(this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
      if (iVar16 < iVar1) {
        iVar16 = iVar1;
      }
      dVar18 = 0.0;
      uVar17 = uVar6;
      while( true ) {
        if ((long)iVar16 == uVar17) {
          pdVar4 = (this->super_HPreData).colCostAtEl.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(this->super_HPreData).colCostAtEl.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
          uVar12 = uVar11;
          if (uVar11 < uVar8) {
            return dVar18 + pdVar4[uVar11];
          }
          goto LAB_001496c6;
        }
        if (uVar7 <= uVar17) break;
        uVar10 = (ulong)piVar2[uVar17];
        uVar8 = uVar13;
        uVar12 = uVar10;
        if (uVar13 <= uVar10) goto LAB_001496c6;
        if (piVar3[uVar10] != 0) {
          uVar8 = uVar14;
          if ((uVar14 <= uVar10) || (uVar8 = uVar15, uVar12 = uVar17, uVar15 <= uVar17))
          goto LAB_001496c6;
          dVar18 = dVar18 + pdVar4[uVar10] * pdVar5[uVar17];
        }
        uVar17 = uVar17 + 1;
        uVar8 = uVar9;
        uVar12 = uVar11;
        if (uVar9 <= uVar11) goto LAB_001496c6;
      }
      uVar8 = uVar7;
      uVar12 = uVar6;
      if (uVar6 < uVar7) {
        uVar12 = uVar7;
      }
    }
  }
LAB_001496c6:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
             uVar8);
}

Assistant:

double HPresolve::getColumnDualPost(int col) {
	int row;
	double z;
	double sum = 0;
	for (int cnt=Astart.at(col); cnt<Aend.at(col); cnt++)
		if (flagRow.at(Aindex.at(cnt))) {
			row = Aindex.at(cnt);
			sum = sum + valueRowDual.at(row)*Avalue.at(cnt);
		}
	z = sum + colCostAtEl.at(col) ;
	return z;
}